

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

int gauden_scale_densities_bwd
              (float64 ***den,uint32 ***den_idx,float64 **scale,uint32 *cb,uint32 n_cb,gauden_t *g)

{
  uint uVar1;
  float64 *pfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  if (g->n_density < g->n_top) {
    __assert_fail("g->n_top <= g->n_density",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x53e,
                  "int gauden_scale_densities_bwd(float64 ***, uint32 ***, float64 **, uint32 *, uint32, gauden_t *)"
                 );
  }
  pfVar2 = *scale;
  uVar3 = 0;
  do {
    if (uVar3 == n_cb) {
      return 0;
    }
    uVar1 = cb[uVar3];
    for (uVar5 = 0; uVar5 < g->n_feat; uVar5 = uVar5 + 1) {
      if ((double)pfVar2[uVar5] <= -708.407751281802) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                ,0x547,"Scaling factor too small: %f\n");
        pfVar2[uVar5] = -698.407751281802;
      }
      uVar4 = 0;
      while (uVar4 < g->n_top) {
        dVar6 = exp((double)den[uVar1][uVar5][uVar4] - (double)pfVar2[uVar5]);
        den[uVar1][uVar5][uVar4] = (float64)dVar6;
        uVar4 = uVar4 + 1;
        if (0x7fefffffffffffff < (ulong)ABS(dVar6)) {
          __assert_fail("finite(den[c][j][k])",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                        ,0x54c,
                        "int gauden_scale_densities_bwd(float64 ***, uint32 ***, float64 **, uint32 *, uint32, gauden_t *)"
                       );
        }
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

int
gauden_scale_densities_bwd(float64 ***den,		/* density array for a mixture Gaussian */
			   uint32 ***den_idx,
			   float64 **scale,
			   uint32 *cb,		/* Codebook indices */
			   uint32 n_cb,		/* total # of codebooks to scale */
			   gauden_t *g)		/* Gaussian density structure */
{
    uint32 i, c, j, k;
    float64 *scl;

    /* make sure this is true at initialization time */
    assert(g->n_top <= g->n_density);

    scl = *scale;

    /* Subtract/Divide max density from others */
    for (i = 0; i < n_cb; i++) {
	c = cb[i];
	for (j = 0; j < g->n_feat; j++) {
	    if (scl[j] <= MINUS_LOG_INFINITY) {
		E_WARN("Scaling factor too small: %f\n", scl[j]);
		scl[j] = MINUS_LOG_INFINITY + MAX_LOG_DEN;
	    }
	    for (k = 0; k < g->n_top; k++) {
		den[c][j][k] = exp(den[c][j][k] - scl[j]);
		assert(finite(den[c][j][k]));
	    }
	}
    }
		
    return S3_SUCCESS;
}